

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_dse_fstore(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  ushort uVar4;
  AliasRet AVar5;
  TRef TVar6;
  ulong uVar7;
  IRIns *pIVar8;
  IRRef1 *pIVar9;
  IRIns *pIVar10;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar4 = J->chain[0x4b];
  if (uVar1 < uVar4) {
    IVar2 = (J->fold).ins.field_0.op2;
    pIVar3 = (J->cur).ir;
    pIVar9 = J->chain + 0x4b;
    do {
      pIVar10 = pIVar3 + uVar4;
      AVar5 = aa_fref(J,pIVar3 + uVar1,pIVar3 + (pIVar10->field_0).op1);
      if (AVar5 == ALIAS_MAY) {
        if ((pIVar10->field_0).op2 != IVar2) break;
      }
      else if (AVar5 == ALIAS_MUST) {
        if ((pIVar10->field_0).op2 == IVar2) {
          return 4;
        }
        if (J->chain[0x11] < uVar4) {
          uVar7 = (ulong)((J->cur).nins - 1);
          if (uVar7 <= uVar4) goto LAB_0014c6c2;
          pIVar8 = pIVar3 + uVar7;
          goto LAB_0014c6a3;
        }
        break;
      }
      uVar4 = (pIVar10->field_0).prev;
      pIVar9 = &(pIVar10->field_0).prev;
    } while (uVar1 < uVar4);
  }
  goto LAB_0014c649;
  while (pIVar8 = pIVar8 + -1, pIVar10 < pIVar8) {
LAB_0014c6a3:
    if (((char)(pIVar8->field_1).t.irt < '\0') ||
       (((pIVar8->field_1).o == 'D' && ((pIVar8->field_0).op2 == pIVar3[uVar1].field_0.op2))))
    goto LAB_0014c649;
  }
LAB_0014c6c2:
  *pIVar9 = (pIVar10->field_0).prev;
  *pIVar10 = (IRIns)0xc0000000000;
LAB_0014c649:
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_fstore(jit_State *J)
{
  IRRef fref = fins->op1;  /* FREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(fref);
  IRRef1 *refp = &J->chain[IR_FSTORE];
  IRRef ref = *refp;
  while (ref > fref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_fref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards or conflicting loads. */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || (ir->o == IR_FLOAD && ir->op2 == xr->op2))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}